

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O2

void __thiscall CMU462::PathTracer::set_scene(PathTracer *this,Scene *scene)

{
  BVHAccel *this_00;
  bool bVar1;
  EnvironmentLight *local_20;
  
  if (this->state != INIT) {
    return;
  }
  if (this->scene != (Scene *)0x0) {
    if (scene != (Scene *)0x0) {
      StaticScene::Scene::~Scene(scene);
    }
    operator_delete(scene,0x30);
    this_00 = this->bvh;
    if (this_00 != (BVHAccel *)0x0) {
      StaticScene::BVHAccel::~BVHAccel(this_00);
    }
    operator_delete(this_00,0x28);
    std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>::
    pop_back(&(this->selectionHistory).c);
  }
  if (this->envLight != (EnvironmentLight *)0x0) {
    local_20 = this->envLight;
    std::vector<CMU462::StaticScene::SceneLight*,std::allocator<CMU462::StaticScene::SceneLight*>>::
    emplace_back<CMU462::StaticScene::SceneLight*>
              ((vector<CMU462::StaticScene::SceneLight*,std::allocator<CMU462::StaticScene::SceneLight*>>
                *)&scene->lights,(SceneLight **)&local_20);
  }
  this->scene = scene;
  build_accel(this);
  bVar1 = has_valid_configuration(this);
  if (bVar1) {
    this->state = READY;
  }
  return;
}

Assistant:

void PathTracer::set_scene(Scene *scene) {

    if (state != INIT) {
      return;
    }

    if (this->scene != nullptr) {
      delete scene;
      delete bvh;
      selectionHistory.pop();
    }

    if (this->envLight != nullptr) {
      scene->lights.push_back(this->envLight);
    }

    this->scene = scene;
    build_accel();

    if (has_valid_configuration()) {
      state = READY;
    }
  }